

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

size_t __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::send_to<asio::const_buffers_1>
          (reactive_socket_service<asio::ip::udp> *this,implementation_type *impl,
          const_buffers_1 *buffers,endpoint_type *destination,message_flags flags,error_code *ec)

{
  size_t sVar1;
  size_t in_RCX;
  error_code *in_RDX;
  const_buffer cVar2;
  const_buffer cVar3;
  size_t n;
  undefined8 in_stack_ffffffffffffffc8;
  
  cVar2 = buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::first
                    ((const_buffers_1 *)in_RDX);
  const_buffer::data((const_buffer *)&stack0xffffffffffffffb8);
  cVar3 = buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::first
                    ((const_buffers_1 *)in_RDX);
  const_buffer::size((const_buffer *)&stack0xffffffffffffffa8);
  ip::basic_endpoint<asio::ip::udp>::data((basic_endpoint<asio::ip::udp> *)0x3b78e9);
  ip::basic_endpoint<asio::ip::udp>::size((basic_endpoint<asio::ip::udp> *)0x3b78f8);
  sVar1 = socket_ops::sync_sendto1
                    ((socket_type)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                     (state_type)((ulong)in_stack_ffffffffffffffc8 >> 0x18),(void *)cVar2.size_,
                     (size_t)cVar2.data_,cVar3.size_._4_4_,cVar3.data_,in_RCX,in_RDX);
  return sVar1;
}

Assistant:

size_t send_to(implementation_type& impl, const ConstBufferSequence& buffers,
      const endpoint_type& destination, socket_base::message_flags flags,
      asio::error_code& ec)
  {
    typedef buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence> bufs_type;

    size_t n;
    if (bufs_type::is_single_buffer)
    {
      n = socket_ops::sync_sendto1(impl.socket_, impl.state_,
          bufs_type::first(buffers).data(),
          bufs_type::first(buffers).size(), flags,
          destination.data(), destination.size(), ec);
    }
    else
    {
      bufs_type bufs(buffers);
      n = socket_ops::sync_sendto(impl.socket_, impl.state_,
          bufs.buffers(), bufs.count(), flags,
          destination.data(), destination.size(), ec);
    }

    ASIO_ERROR_LOCATION(ec);
    return n;
  }